

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::
FormatForComparisonFailureMessage<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,internal *this,
          basic_string_view<char,_std::char_traits<char>_> *value,
          basic_string_view<char,_std::char_traits<char>_> *param_2)

{
  basic_string_view<char,_std::char_traits<char>_> *param_1_local;
  basic_string_view<char,_std::char_traits<char>_> *value_local;
  
  PrintToString<std::basic_string_view<char,std::char_traits<char>>>
            (__return_storage_ptr__,(iutest *)this,value);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}